

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxmainsm.hpp
# Opt level: O0

void __thiscall
soplex::SPxMainSM<double>::RowSingletonPS::execute
          (RowSingletonPS *this,VectorBase<double> *x,VectorBase<double> *y,VectorBase<double> *s,
          VectorBase<double> *r,DataArray<soplex::SPxSolverBase<double>::VarStatus> *cStatus,
          DataArray<soplex::SPxSolverBase<double>::VarStatus> *rStatus,bool isOptimal)

{
  VarStatus VVar1;
  bool bVar2;
  int iVar3;
  double *pdVar4;
  VarStatus *pVVar5;
  char *pcVar6;
  int __c;
  int __c_00;
  long *in_RDI;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_R9;
  double dVar7;
  double dVar8;
  DataArray<soplex::SPxSolverBase<double>::VarStatus> *in_stack_00000008;
  double newUp;
  double newLo;
  int k;
  double val;
  double aij;
  double in_stack_fffffffffffffd48;
  double dVar9;
  VectorBase<double> *in_stack_fffffffffffffd50;
  SVectorBase<double> *in_stack_fffffffffffffd58;
  double local_b8;
  double local_b0;
  uint local_4c;
  VectorBase<double> *local_48;
  
  if ((int)in_RDI[5] != *(int *)((long)in_RDI + 0x2c)) {
    pdVar4 = VectorBase<double>::operator[]
                       (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    dVar9 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    *pdVar4 = dVar9;
    pdVar4 = VectorBase<double>::operator[]
                       (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    dVar9 = *pdVar4;
    pdVar4 = VectorBase<double>::operator[]
                       (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    *pdVar4 = dVar9;
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,(int)in_RDI[5]);
    VVar1 = *pVVar5;
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,*(int *)((long)in_RDI + 0x2c));
    *pVVar5 = VVar1;
  }
  dVar7 = SVectorBase<double>::operator[]
                    (in_stack_fffffffffffffd58,(int)((ulong)in_stack_fffffffffffffd50 >> 0x20));
  pdVar4 = VectorBase<double>::operator[]
                     (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  dVar9 = *pdVar4;
  pdVar4 = VectorBase<double>::operator[]
                     (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  *pdVar4 = dVar7 * dVar9;
  local_48 = (VectorBase<double> *)in_RDI[10];
  for (local_4c = 0; iVar3 = SVectorBase<double>::size((SVectorBase<double> *)(in_RDI + 0xc)),
      (int)local_4c < iVar3; local_4c = local_4c + 1) {
    pcVar6 = SVectorBase<double>::index
                       ((SVectorBase<double> *)(in_RDI + 0xc),(char *)(ulong)local_4c,__c);
    if ((int)pcVar6 != (int)in_RDI[5]) {
      pdVar4 = SVectorBase<double>::value((SVectorBase<double> *)(in_RDI + 0xc),local_4c);
      dVar9 = *pdVar4;
      SVectorBase<double>::index
                ((SVectorBase<double> *)(in_RDI + 0xc),(char *)(ulong)local_4c,__c_00);
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
      ;
      local_48 = (VectorBase<double> *)((double)local_48 - dVar9 * *pdVar4);
    }
  }
  if (dVar7 <= 0.0) {
    local_b0 = (double)in_RDI[8];
  }
  else {
    local_b0 = (double)in_RDI[7];
  }
  local_b0 = local_b0 / dVar7;
  if (dVar7 <= 0.0) {
    local_b8 = (double)in_RDI[7];
  }
  else {
    local_b8 = (double)in_RDI[8];
  }
  local_b8 = local_b8 / dVar7;
  pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[6]);
  iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
  switch(*pVVar5) {
  case ON_UPPER:
    VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
    (**(code **)(*in_RDI + 0x30))();
    bVar2 = EQrel<double,double,double>
                      ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       1.419076592808e-317);
    if (bVar2) {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = BASIC;
      dVar9 = (double)in_RDI[0x13];
      iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = dVar9;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = (double)local_48;
    }
    else {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[6])
      ;
      *pVVar5 = BASIC;
      VectorBase<double>::operator[]
                (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41920900240108e-317);
      iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = (uint)bVar2;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = (double)local_48 / dVar7;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = 0.0;
    }
    break;
  case ON_LOWER:
    VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
    (**(code **)(*in_RDI + 0x30))();
    bVar2 = EQrel<double,double,double>
                      ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       1.41882906591943e-317);
    if (bVar2) {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = BASIC;
      dVar9 = (double)in_RDI[0x13];
      iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = dVar9;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = (double)local_48;
    }
    else {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[6])
      ;
      *pVVar5 = BASIC;
      VectorBase<double>::operator[]
                (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41896147551252e-317);
      iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = (uint)bVar2;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = (double)local_48 / dVar7;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = 0.0;
    }
    break;
  case FIXED:
    if ((local_b0 <= (double)in_RDI[0x11]) && ((double)in_RDI[0x12] <= local_b8)) {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = BASIC;
      dVar9 = (double)in_RDI[0x13];
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
      ;
      *pdVar4 = dVar9;
      return;
    }
    (**(code **)(*in_RDI + 0x30))();
    bVar2 = EQrel<double,double,double>
                      ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       1.41736663160774e-317);
    if (!bVar2) {
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41807215735e-317);
      if (bVar2) {
        pdVar4 = VectorBase<double>::operator[]
                           (in_stack_fffffffffffffd50,
                            (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        dVar9 = *pdVar4;
        dVar8 = (double)(**(code **)(*in_RDI + 0x30))();
        if (dVar8 <= dVar9) {
          VectorBase<double>::operator[]
                    (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
          (**(code **)(*in_RDI + 0x30))();
          bVar2 = EQrel<double,double,double>
                            ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                             1.41816207729755e-317);
          iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
          pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (in_stack_00000008,(int)in_RDI[5]);
          *pVVar5 = (uint)bVar2;
          pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                             (in_R9,(int)in_RDI[6]);
          *pVVar5 = BASIC;
          pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
          *pdVar4 = (double)local_48 / dVar7;
          pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
          *pdVar4 = 0.0;
          return;
        }
        pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_R9,(int)in_RDI[6]);
        iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
        *pVVar5 = ON_UPPER;
        pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,(int)in_RDI[5]);
        *pVVar5 = BASIC;
        dVar9 = (double)in_RDI[0x13];
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
        *pdVar4 = dVar9;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
        *pdVar4 = (double)local_48;
        return;
      }
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41838638310076e-317);
      if (!bVar2) {
        pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,(int)in_RDI[5]);
        *pVVar5 = BASIC;
        dVar9 = (double)in_RDI[0x13];
        pdVar4 = VectorBase<double>::operator[]
                           (in_stack_fffffffffffffd50,
                            (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        *pdVar4 = dVar9;
        return;
      }
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
      ;
      dVar9 = *pdVar4;
      dVar8 = (double)(**(code **)(*in_RDI + 0x30))();
      if (dVar9 <= -dVar8) {
        VectorBase<double>::operator[]
                  (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        (**(code **)(*in_RDI + 0x30))();
        bVar2 = EQrel<double,double,double>
                          ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                           1.41848618436122e-317);
        iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
        pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_stack_00000008,(int)in_RDI[5]);
        *pVVar5 = (uint)bVar2;
        pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                           (in_R9,(int)in_RDI[6]);
        *pVVar5 = BASIC;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
        *pdVar4 = (double)local_48 / dVar7;
        pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
        *pdVar4 = 0.0;
        return;
      }
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[6])
      ;
      iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      *pVVar5 = ON_LOWER;
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = BASIC;
      dVar9 = (double)in_RDI[0x13];
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = dVar9;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = (double)local_48;
      return;
    }
    (**(code **)(*in_RDI + 0x30))();
    bVar2 = EQrel<double,double,double>
                      ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       1.41740763905635e-317);
    if (bVar2) {
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = BASIC;
      dVar9 = (double)in_RDI[0x13];
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
      ;
      *pdVar4 = dVar9;
      return;
    }
    VectorBase<double>::operator[]
              (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
    (**(code **)(*in_RDI + 0x30))();
    bVar2 = EQrel<double,double,double>
                      ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                       1.41750249966035e-317);
    if (bVar2) {
      pdVar4 = VectorBase<double>::operator[]
                         (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20))
      ;
      dVar9 = *pdVar4;
      dVar8 = (double)(**(code **)(*in_RDI + 0x30))();
      if (-dVar8 < dVar9) goto LAB_002bc7a4;
LAB_002bc91d:
      VectorBase<double>::operator[]
                (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41778708147235e-317);
      iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = (uint)bVar2;
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[6])
      ;
      *pVVar5 = BASIC;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = (double)local_48 / dVar7;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = 0.0;
    }
    else {
LAB_002bc7a4:
      VectorBase<double>::operator[]
                (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41759785433e-317);
      if (bVar2) {
        pdVar4 = VectorBase<double>::operator[]
                           (in_stack_fffffffffffffd50,
                            (int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        dVar9 = *pdVar4;
        dVar8 = (double)(**(code **)(*in_RDI + 0x30))();
        if (dVar8 <= dVar9) goto LAB_002bc91d;
      }
      VectorBase<double>::operator[]
                (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41768332768673e-317);
      if (!bVar2) {
        VectorBase<double>::operator[]
                  (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
        (**(code **)(*in_RDI + 0x30))();
        bVar2 = EQrel<double,double,double>
                          ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                           1.4177337223826e-317);
        if (!bVar2) goto LAB_002bc91d;
      }
      VectorBase<double>::operator[]
                (in_stack_fffffffffffffd50,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
      (**(code **)(*in_RDI + 0x30))();
      bVar2 = EQrel<double,double,double>
                        ((double)in_stack_fffffffffffffd50,in_stack_fffffffffffffd48,
                         1.41793036050965e-317);
      iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[](in_R9,(int)in_RDI[6])
      ;
      *pVVar5 = (uint)bVar2;
      pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                         (in_stack_00000008,(int)in_RDI[5]);
      *pVVar5 = BASIC;
      dVar9 = (double)in_RDI[0x13];
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = dVar9;
      pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
      *pdVar4 = (double)local_48;
    }
    break;
  case ZERO:
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,(int)in_RDI[5]);
    *pVVar5 = BASIC;
    dVar9 = (double)in_RDI[0x13];
    pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,(int)((ulong)dVar9 >> 0x20));
    *pdVar4 = dVar9;
    pdVar4 = VectorBase<double>::operator[](local_48,(int)((ulong)dVar9 >> 0x20));
    *pdVar4 = (double)local_48;
    break;
  case BASIC:
    pVVar5 = DataArray<soplex::SPxSolverBase<double>::VarStatus>::operator[]
                       (in_stack_00000008,(int)in_RDI[5]);
    *pVVar5 = BASIC;
    dVar9 = (double)in_RDI[0x13];
    iVar3 = (int)((ulong)in_stack_fffffffffffffd48 >> 0x20);
    pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
    *pdVar4 = dVar9;
    pdVar4 = VectorBase<double>::operator[](in_stack_fffffffffffffd50,iVar3);
    *pdVar4 = 0.0;
  }
  return;
}

Assistant:

void SPxMainSM<R>::RowSingletonPS::execute(VectorBase<R>& x, VectorBase<R>& y, VectorBase<R>& s,
      VectorBase<R>& r,
      DataArray<typename SPxSolverBase<R>::VarStatus>& cStatus,
      DataArray<typename SPxSolverBase<R>::VarStatus>& rStatus, bool isOptimal) const
{
   // correcting the change of idx by deletion of the row:
   if(m_i != m_old_i)
   {
      y[m_old_i] = y[m_i];
      s[m_old_i] = s[m_i];
      rStatus[m_old_i] = rStatus[m_i];
   }

   R aij = m_col[m_i];
   assert(aij != 0.0);

   // primal:
   s[m_i] = aij * x[m_j];

   // dual & basis:
   R val = m_obj;

   for(int k = 0; k < m_col.size(); ++k)
   {
      if(m_col.index(k) != m_i)
         val -= m_col.value(k) * y[m_col.index(k)];
   }

   R newLo = (aij > 0) ? m_lhs / aij : m_rhs / aij; // implicit lhs
   R newUp = (aij > 0) ? m_rhs / aij : m_lhs / aij; // implicit rhs

   switch(cStatus[m_j])
   {
   case SPxSolverBase<R>::FIXED:
      if(newLo <= m_oldLo && newUp >= m_oldUp)
      {
         // this row is totally redundant, has not changed bound of xj
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }
      else if(EQrel(newLo, newUp, this->feastol()))
      {
         // row is in the type  aij * xj = b
         assert(EQrel(newLo, x[m_j], this->feastol()));

         if(EQrel(m_oldLo, m_oldUp, this->feastol()))
         {
            // xj has been fixed in other row
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
         }
         else if((EQrel(m_oldLo, x[m_j], this->feastol()) && r[m_j] <= -this->feastol())
                 || (EQrel(m_oldUp, x[m_j], this->feastol()) && r[m_j] >= this->feastol())
                 || (!EQrel(m_oldLo, x[m_j], this->feastol()) && !(EQrel(m_oldUp, x[m_j], this->feastol()))))
         {
            // if x_j on lower but reduced cost is negative, or x_j on upper but reduced cost is positive, or x_j not on bound: basic
            rStatus[m_i] = (EQrel(m_lhs, x[m_j] * aij,
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            // set x_j on one of the bound
            assert(EQrel(m_oldLo, x[m_j], this->feastol()) || EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = EQrel(m_oldLo, x[m_j],
                                 this->feastol()) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newLo, m_oldUp, this->feastol()))
      {
         // row is in the type  xj >= b/aij, try to set xj on upper
         if(r[m_j] >= this->feastol())
         {
            // the reduced cost is positive, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldUp, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_UPPER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else if(EQrel(newUp, m_oldLo, this->feastol()))
      {
         // row is in the type  xj <= b/aij, try to set xj on lower
         if(r[m_j] <= -this->feastol())
         {
            // the reduced cost is negative, xj should in the basic
            assert(EQrel(m_rhs / aij, x[m_j], this->feastol()) || EQrel(m_lhs / aij, x[m_j], this->feastol()));

            rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                                  this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
            cStatus[m_j] = SPxSolverBase<R>::BASIC;
            y[m_i] = val / aij;
            r[m_j] = 0.0;
         }
         else
         {
            assert(EQrel(m_oldLo, x[m_j], this->feastol()));

            cStatus[m_j] = SPxSolverBase<R>::ON_LOWER;
            rStatus[m_i] = SPxSolverBase<R>::BASIC;
            y[m_i] = m_row_obj;
            r[m_j] = val;
         }
      }
      else
      {
         // the variable is set to FIXED by other constraints, i.e., this singleton row is redundant
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
      }

      break;

   case SPxSolverBase<R>::BASIC:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = 0.0;
      break;

   case SPxSolverBase<R>::ON_LOWER:
      if(EQrel(m_oldLo, x[m_j], this->feastol())) // xj may stay on lower
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are negative or old lower bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ON_UPPER:
      if(EQrel(m_oldUp, x[m_j], this->feastol())) // xj may stay on upper
      {
         rStatus[m_i] = SPxSolverBase<R>::BASIC;
         y[m_i] = m_row_obj;
         r[m_j] = val;
      }
      else // if reduced costs are positive or old upper bound not equal to xj, we need to change xj into the basis
      {
         assert(!isOptimal || EQrel(m_rhs / aij, x[m_j], this->feastol())
                || EQrel(m_lhs / aij, x[m_j], this->feastol()));

         cStatus[m_j] = SPxSolverBase<R>::BASIC;
         rStatus[m_i] = (EQrel(m_lhs / aij, x[m_j],
                               this->feastol())) ? SPxSolverBase<R>::ON_LOWER : SPxSolverBase<R>::ON_UPPER;
         y[m_i] = val / aij;
         r[m_j] = 0.0;
      }

      break;

   case SPxSolverBase<R>::ZERO:
      rStatus[m_i] = SPxSolverBase<R>::BASIC;
      y[m_i] = m_row_obj;
      r[m_j] = val;
      break;

   default:
      break;
   }

#ifdef SOPLEX_CHECK_BASIS_DIM

   if(!this->checkBasisDim(rStatus, cStatus))
   {
      throw SPxInternalCodeException("XMAISM17 Dimension doesn't match after this step.");
   }

#endif
}